

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  LocationRecorder *pLVar1;
  bool bVar2;
  int iVar3;
  DescriptorProto *message;
  EnumDescriptorProto *enum_type;
  ServiceDescriptorProto *service;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dependency;
  RepeatedField<int> *public_dependency;
  RepeatedField<int> *weak_dependency;
  FileOptions *options;
  ErrorMaker local_168;
  undefined1 local_158 [8];
  LocationRecorder location_4;
  string_view local_130;
  string_view local_120;
  undefined1 local_110 [8];
  LocationRecorder location_3;
  undefined1 local_e8 [8];
  LocationRecorder location_2;
  undefined1 local_c0 [8];
  LocationRecorder location_1;
  undefined1 local_88 [8];
  LocationRecorder location;
  string_view local_60;
  string_view local_50;
  SymbolVisibility local_3c;
  undefined1 auStack_38 [4];
  SymbolVisibility visibility;
  LocationRecorder *local_28;
  LocationRecorder *root_location_local;
  FileDescriptorProto *file_local;
  Parser *this_local;
  
  local_28 = root_location;
  root_location_local = (LocationRecorder *)file;
  file_local = (FileDescriptorProto *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38,";");
  bVar2 = TryConsumeEndOfDeclaration(this,_auStack_38,(LocationRecorder *)0x0);
  if (bVar2) {
    this_local._7_1_ = 1;
    goto LAB_002b7a48;
  }
  local_3c = VISIBILITY_UNSET;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"export");
  bVar2 = LookingAt(this,local_50);
  if (bVar2) {
LAB_002b74c2:
    bVar2 = ParseVisibility(this,(FileDescriptorProto *)root_location_local,&local_3c);
    if (!bVar2) {
      this_local._7_1_ = 0;
      goto LAB_002b7a48;
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"local");
    bVar2 = LookingAt(this,local_60);
    if (bVar2) goto LAB_002b74c2;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,"message");
  bVar2 = LookingAt(this,stack0xffffffffffffff90);
  pLVar1 = local_28;
  if (bVar2) {
    iVar3 = FileDescriptorProto::message_type_size((FileDescriptorProto *)root_location_local);
    LocationRecorder::LocationRecorder((LocationRecorder *)local_88,pLVar1,4,iVar3);
    iVar3 = internal::cpp::MaxMessageDeclarationNestingDepth();
    this->recursion_depth_ = iVar3;
    message = FileDescriptorProto::add_message_type((FileDescriptorProto *)root_location_local);
    this_local._7_1_ =
         ParseMessageDefinition
                   (this,message,&local_3c,(LocationRecorder *)local_88,
                    (FileDescriptorProto *)root_location_local);
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_88);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&location_1.location_,"enum");
    bVar2 = LookingAt(this,stack0xffffffffffffff58);
    pLVar1 = local_28;
    if (bVar2) {
      iVar3 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)root_location_local);
      LocationRecorder::LocationRecorder((LocationRecorder *)local_c0,pLVar1,5,iVar3);
      enum_type = FileDescriptorProto::add_enum_type((FileDescriptorProto *)root_location_local);
      this_local._7_1_ =
           ParseEnumDefinition(this,enum_type,&local_3c,(LocationRecorder *)local_c0,
                               (FileDescriptorProto *)root_location_local);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_c0);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&location_2.location_,"service"
                );
      bVar2 = LookingAt(this,stack0xffffffffffffff30);
      pLVar1 = local_28;
      if (bVar2) {
        iVar3 = FileDescriptorProto::service_size((FileDescriptorProto *)root_location_local);
        LocationRecorder::LocationRecorder((LocationRecorder *)local_e8,pLVar1,6,iVar3);
        service = FileDescriptorProto::add_service((FileDescriptorProto *)root_location_local);
        this_local._7_1_ =
             ParseServiceDefinition
                       (this,service,(LocationRecorder *)local_e8,
                        (FileDescriptorProto *)root_location_local);
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_e8);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&location_3.location_,
                   "extend");
        bVar2 = LookingAt(this,stack0xffffffffffffff08);
        if (bVar2) {
          LocationRecorder::LocationRecorder((LocationRecorder *)local_110,local_28,7);
          extensions = FileDescriptorProto::mutable_extension
                                 ((FileDescriptorProto *)root_location_local);
          messages = FileDescriptorProto::mutable_message_type
                               ((FileDescriptorProto *)root_location_local);
          this_local._7_1_ =
               ParseExtend(this,extensions,messages,local_28,4,(LocationRecorder *)local_110,
                           (FileDescriptorProto *)root_location_local);
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_110);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_120,"import");
          bVar2 = LookingAt(this,local_120);
          if (bVar2) {
            dependency = FileDescriptorProto::mutable_dependency_abi_cxx11_
                                   ((FileDescriptorProto *)root_location_local);
            public_dependency =
                 FileDescriptorProto::mutable_public_dependency
                           ((FileDescriptorProto *)root_location_local);
            weak_dependency =
                 FileDescriptorProto::mutable_weak_dependency
                           ((FileDescriptorProto *)root_location_local);
            this_local._7_1_ =
                 ParseImport(this,dependency,public_dependency,weak_dependency,local_28,
                             (FileDescriptorProto *)root_location_local);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_130,"package");
            bVar2 = LookingAt(this,local_130);
            if (bVar2) {
              this_local._7_1_ =
                   ParsePackage(this,(FileDescriptorProto *)root_location_local,local_28,
                                (FileDescriptorProto *)root_location_local);
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&location_4.location_,
                         "option");
              bVar2 = LookingAt(this,stack0xfffffffffffffec0);
              if (bVar2) {
                LocationRecorder::LocationRecorder((LocationRecorder *)local_158,local_28,8);
                options = FileDescriptorProto::mutable_options
                                    ((FileDescriptorProto *)root_location_local);
                this_local._7_1_ =
                     ParseOption(this,&options->super_Message,(LocationRecorder *)local_158,
                                 (FileDescriptorProto *)root_location_local,OPTION_STATEMENT);
                LocationRecorder::~LocationRecorder((LocationRecorder *)local_158);
              }
              else {
                ErrorMaker::ErrorMaker
                          (&local_168,"Expected top-level statement (e.g. \"message\").");
                RecordError(this,local_168);
                this_local._7_1_ = 0;
              }
            }
          }
        }
      }
    }
  }
LAB_002b7a48:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  }

  SymbolVisibility visibility = SymbolVisibility::VISIBILITY_UNSET;
  if (LookingAt("export") || LookingAt("local")) {
    DO(ParseVisibility(file, &visibility));
  }

  if (LookingAt("message")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kMessageTypeFieldNumber,
                              file->message_type_size());
    // Maximum depth allowed by the DescriptorPool.
    recursion_depth_ = internal::cpp::MaxMessageDeclarationNestingDepth();
    return ParseMessageDefinition(file->add_message_type(), visibility,
                                  location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kEnumTypeFieldNumber,
                              file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), visibility, location,
                               file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kServiceFieldNumber,
                              file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(
        file->mutable_extension(), file->mutable_message_type(), root_location,
        FileDescriptorProto::kMessageTypeFieldNumber, location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(), root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    RecordError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}